

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodemb.c
# Opt level: O3

void encode_block_inter(int plane,int block,int blk_row,int blk_col,BLOCK_SIZE plane_bsize,
                       TX_SIZE tx_size,void *arg,RUN_TYPE dry_run)

{
  MACROBLOCKD *xd;
  char cVar1;
  ushort uVar2;
  int iVar3;
  int iVar4;
  MACROBLOCK *x;
  MB_MODE_INFO *pMVar5;
  ulong uVar6;
  TX_TYPE tx_type;
  byte bVar7;
  ulong uVar8;
  ENTROPY_CONTEXT *l;
  int iVar9;
  long lVar10;
  size_t __n;
  uint uVar11;
  int iVar12;
  long lVar13;
  undefined7 in_register_00000081;
  uint uVar14;
  int iVar15;
  size_t __n_00;
  int iVar16;
  CommonQuantParams *quant_params;
  bool bVar17;
  long local_120;
  int dummy_rate_cost;
  ulong local_b0;
  macroblockd_plane *local_a8;
  ENTROPY_CONTEXT *local_a0;
  long local_98;
  uint8_t *local_90;
  tran_low_t *local_88;
  long local_80;
  QUANT_PARAM local_78;
  TXB_CTX local_50;
  TxfmParam txfm_param;
  
  x = *(MACROBLOCK **)((long)arg + 8);
  lVar13 = (long)plane;
  uVar8 = CONCAT71(in_register_00000081,plane_bsize) & 0xffffffff;
  uVar14 = (uint)block_size_high[uVar8];
  iVar15 = (x->e_mbd).mb_to_bottom_edge;
  if (iVar15 < 0) {
    uVar14 = (uint)block_size_high[uVar8] +
             (iVar15 >> ((char)(x->e_mbd).plane[lVar13].subsampling_y + 3U & 0x1f));
  }
  uVar11 = (uint)block_size_wide[uVar8];
  iVar15 = (x->e_mbd).mb_to_right_edge;
  if (iVar15 < 0) {
    uVar11 = (uint)block_size_wide[uVar8] +
             (iVar15 >> ((char)(x->e_mbd).plane[lVar13].subsampling_x + 3U & 0x1f));
  }
  iVar15 = ((int)uVar14 >> 2) - blk_row;
  if (iVar15 == 0 || (int)uVar14 >> 2 < blk_row) {
    return;
  }
  iVar9 = ((int)uVar11 >> 2) - blk_col;
  if (iVar9 == 0 || (int)uVar11 >> 2 < blk_col) {
    return;
  }
  pMVar5 = *(x->e_mbd).mi;
  uVar6 = (ulong)tx_size;
  if ((plane == 0) &&
     (pMVar5->inter_tx_size
      [(blk_col >> (av1_get_txb_size_index_tw_w_log2_table[uVar8] & 0x1f)) +
       ((blk_row >> (av1_get_txb_size_index_tw_h_log2_table[uVar8] & 0x1f)) <<
       (av1_get_txb_size_index_stride_log2_table[uVar8] & 0x1f))] != tx_size)) {
    iVar3 = *(int *)((long)tx_size_high_unit + (ulong)((uint)tx_size * 4));
    if (iVar3 < iVar15) {
      iVar15 = iVar3;
    }
    iVar3 = *(int *)((long)tx_size_wide_unit + (ulong)((uint)tx_size * 4));
    if (iVar3 < iVar9) {
      iVar9 = iVar3;
    }
    if (iVar15 < 1) {
      return;
    }
    bVar7 = ""[uVar6];
    iVar3 = tx_size_wide_unit[bVar7];
    iVar4 = tx_size_high_unit[bVar7];
    iVar12 = 0;
    do {
      if (0 < iVar9) {
        iVar16 = 0;
        do {
          encode_block_inter(0,block,blk_row + iVar12,blk_col + iVar16,plane_bsize,bVar7,arg,dry_run
                            );
          block = block + iVar4 * iVar3;
          iVar16 = iVar16 + iVar3;
        } while (iVar16 < iVar9);
      }
      iVar12 = iVar12 + iVar4;
    } while (iVar12 < iVar15);
    return;
  }
  xd = &x->e_mbd;
  local_a8 = (x->e_mbd).plane + lVar13;
  lVar10 = *arg;
  local_80 = lVar13 * 0x88;
  local_88 = x->plane[lVar13].dqcoeff + (block << 4);
  dummy_rate_cost = 0;
  local_98 = (long)blk_col;
  local_a0 = (ENTROPY_CONTEXT *)(*(long *)((long)arg + 0x18) + local_98);
  l = (ENTROPY_CONTEXT *)(*(long *)((long)arg + 0x20) + (long)blk_row);
  local_90 = (x->e_mbd).plane[lVar13].dst.buf +
             ((x->e_mbd).plane[lVar13].dst.stride * blk_row + blk_col) * 4;
  if (((x->txfm_search_info).blk_skip
       [(int)((uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                    [uVar8] * blk_row + blk_col)] >> (plane & 0x1fU) & 1) == 0) {
    uVar2 = *(ushort *)&pMVar5->field_0xa7;
    if ((uVar2 & 0x40) == 0) {
      if (((x->e_mbd).lossless[uVar2 & 7] == 0) && ((0x61810UL >> (uVar6 & 0x3f) & 1) == 0)) {
        uVar8 = (ulong)local_a8->plane_type;
        if (uVar8 == 0) {
          local_b0 = CONCAT71(in_register_00000081,
                              (x->e_mbd).tx_type_map
                              [(x->e_mbd).tx_type_map_stride * blk_row + blk_col]);
        }
        else {
          if (((char)uVar2 < '\0') || ('\0' < pMVar5->ref_frame[0])) {
            bVar7 = (x->e_mbd).tx_type_map
                    [(blk_row << ((byte)(x->e_mbd).plane[uVar8].subsampling_y & 0x1f)) *
                     (x->e_mbd).tx_type_map_stride +
                     (blk_col << ((byte)(x->e_mbd).plane[uVar8].subsampling_x & 0x1f))];
            uVar14 = 1;
            if (-1 < (char)uVar2) {
              uVar14 = (uint)('\0' < pMVar5->ref_frame[0]);
            }
          }
          else {
            bVar7 = intra_mode_to_tx_type__intra_mode_to_tx_type
                    [(byte)get_uv_mode_uv2y[pMVar5->uv_mode]];
            uVar14 = 0;
          }
          if ((0x18608UL >> (uVar6 & 0x3f) & 1) == 0) {
            if (*(char *)(lVar10 + 0x3c175) == '\0') {
              uVar14 = (uint)av1_ext_tx_set_lookup[0]
                             [(ulong)((0x60604UL >> (uVar6 & 0x3f) & 1) != 0) + (ulong)(uVar14 * 2)]
              ;
            }
            else {
              uVar14 = (uint)(byte)((uVar14 == 0) + 1);
            }
          }
          local_b0 = (ulong)bVar7;
          if (*(int *)((long)av1_ext_tx_used[0] + local_b0 * 4 + (ulong)(uVar14 << 6)) == 0) {
            local_b0 = 0;
          }
        }
      }
      else {
        local_b0 = 0;
      }
      cVar1 = *(char *)((long)arg + 0x29);
      tx_type = (TX_TYPE)local_b0;
      av1_setup_xform((AV1_COMMON *)(lVar10 + 0x3bf80),x,tx_size,tx_type,&txfm_param);
      iVar15 = *(int *)(lVar10 + 0x423fc);
      local_78.log_scale = av1_get_tx_scale(tx_size);
      quant_params = (CommonQuantParams *)(lVar10 + 0x3c1e8);
      local_78.tx_size = tx_size;
      local_78.use_quant_b_adapt = iVar15;
      local_78.use_optimize_b = (uint)((dry_run == '\0' || cVar1 != '\x02') && cVar1 != '\0');
      local_78.xform_quant_idx = (uint)(dry_run != '\0' && cVar1 == '\x02' || cVar1 == '\0');
      local_78.qmatrix = av1_get_qmatrix(quant_params,xd,plane,tx_size,tx_type);
      local_78.iqmatrix = av1_get_iqmatrix(quant_params,xd,plane,tx_size,tx_type);
      av1_xform_quant(x,plane,block,blk_row,blk_col,plane_bsize,&txfm_param,&local_78);
      if (local_78.use_optimize_b != 0) {
        get_txb_ctx(plane_bsize,tx_size,plane,local_a0,l,&local_50);
        av1_optimize_b(*arg,x,plane,block,tx_size,tx_type,&local_50,&dummy_rate_cost);
        if (local_78.use_optimize_b != 0) goto LAB_001aa838;
      }
      av1_dropout_qcoeff(x,plane,block,tx_size,tx_type,quant_params->base_qindex);
      goto LAB_001aa838;
    }
  }
  x->plane[lVar13].eobs[block] = 0;
  x->plane[lVar13].txb_entropy_ctx[block] = '\0';
  local_b0 = 0;
LAB_001aa838:
  local_120 = (long)block;
  __n = (size_t)*(int *)((long)tx_size_wide_unit + (ulong)((uint)tx_size * 4));
  uVar14 = (uint)*(byte *)(*(long *)((long)&x->plane[0].txb_entropy_ctx + local_80) + local_120);
  memset(local_a0,uVar14,__n);
  __n_00 = (size_t)*(int *)((long)tx_size_high_unit + (ulong)((uint)tx_size * 4));
  memset(l,uVar14,__n_00);
  uVar2 = x->plane[lVar13].eobs[local_120];
  if (uVar2 == 0) {
    pMVar5->skip_txfm = pMVar5->skip_txfm & 1;
    bVar17 = true;
  }
  else {
    pMVar5->skip_txfm = '\0';
    av1_inverse_transform_block
              (xd,local_88,plane,(TX_TYPE)local_b0,tx_size,local_90,(local_a8->dst).stride,
               (uint)uVar2,(uint)*(byte *)(lVar10 + 0x3c175));
    bVar17 = x->plane[lVar13].eobs[local_120] == 0;
  }
  if ((plane == 0) && (bVar17)) {
    iVar15 = (x->e_mbd).tx_type_map_stride;
    (x->e_mbd).tx_type_map[blk_row * iVar15 + blk_col] = '\0';
    if (((0x41010UL >> (uVar6 & 0x3f) & 1) != 0) || ((0x20810UL >> (uVar6 & 0x3f) & 1) != 0)) {
      local_98 = (long)blk_row * (long)iVar15 + local_98;
      lVar13 = 0;
      do {
        lVar10 = 0;
        do {
          (x->e_mbd).tx_type_map[lVar10 + local_98] = '\0';
          lVar10 = lVar10 + 4;
        } while (lVar10 < (long)__n);
        lVar13 = lVar13 + 4;
        local_98 = local_98 + (long)iVar15 * 4;
      } while (lVar13 < (long)__n_00);
    }
  }
  return;
}

Assistant:

static void encode_block_inter(int plane, int block, int blk_row, int blk_col,
                               BLOCK_SIZE plane_bsize, TX_SIZE tx_size,
                               void *arg, RUN_TYPE dry_run) {
  struct encode_b_args *const args = arg;
  MACROBLOCK *const x = args->x;
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  const struct macroblockd_plane *const pd = &xd->plane[plane];
  const int max_blocks_high = max_block_high(xd, plane_bsize, plane);
  const int max_blocks_wide = max_block_wide(xd, plane_bsize, plane);

  if (blk_row >= max_blocks_high || blk_col >= max_blocks_wide) return;

  const TX_SIZE plane_tx_size =
      plane ? av1_get_max_uv_txsize(mbmi->bsize, pd->subsampling_x,
                                    pd->subsampling_y)
            : mbmi->inter_tx_size[av1_get_txb_size_index(plane_bsize, blk_row,
                                                         blk_col)];
  if (!plane) {
    assert(tx_size_wide[tx_size] >= tx_size_wide[plane_tx_size] &&
           tx_size_high[tx_size] >= tx_size_high[plane_tx_size]);
  }

  if (tx_size == plane_tx_size || plane) {
    encode_block(plane, block, blk_row, blk_col, plane_bsize, tx_size, arg,
                 dry_run);
  } else {
    assert(tx_size < TX_SIZES_ALL);
    const TX_SIZE sub_txs = sub_tx_size_map[tx_size];
    assert(IMPLIES(tx_size <= TX_4X4, sub_txs == tx_size));
    assert(IMPLIES(tx_size > TX_4X4, sub_txs < tx_size));
    // This is the square transform block partition entry point.
    const int bsw = tx_size_wide_unit[sub_txs];
    const int bsh = tx_size_high_unit[sub_txs];
    const int step = bsh * bsw;
    const int row_end =
        AOMMIN(tx_size_high_unit[tx_size], max_blocks_high - blk_row);
    const int col_end =
        AOMMIN(tx_size_wide_unit[tx_size], max_blocks_wide - blk_col);
    assert(bsw > 0 && bsh > 0);

    for (int row = 0; row < row_end; row += bsh) {
      const int offsetr = blk_row + row;
      for (int col = 0; col < col_end; col += bsw) {
        const int offsetc = blk_col + col;

        encode_block_inter(plane, block, offsetr, offsetc, plane_bsize, sub_txs,
                           arg, dry_run);
        block += step;
      }
    }
  }
}